

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_reporter.h
# Opt level: O0

progress_reporter * __thiscall
bandit::detail::progress_reporter::current_context_name_abi_cxx11_(progress_reporter *this)

{
  iterator __first;
  iterator __last;
  long in_RSI;
  progress_reporter *this_local;
  string *name;
  
  std::__cxx11::string::string((string *)this);
  __first = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(in_RSI + 0x20));
  __last = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0x20));
  std::
  for_each<std::_List_iterator<std::__cxx11::string>,bandit::detail::progress_reporter::current_context_name()::_lambda(std::__cxx11::string)_1_>
            ((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first._M_node,
             (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last._M_node,(anon_class_8_1_898f2789)this);
  return this;
}

Assistant:

std::string current_context_name()
    {
      std::string name;

      std::for_each(contexts_.begin(), contexts_.end(), [&](const std::string context){
          if(name.size() > 0)
          {
          name += " ";
          }

          name += context;
          });

      return name;
    }